

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall
wallet::DescriptorScriptPubKeyMan::HasWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *desc)

{
  uint256 *puVar1;
  uchar *puVar2;
  uint64_t *puVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  puVar1 = &(this->m_wallet_descriptor).id;
  puVar3 = &(this->m_wallet_descriptor).creation_time;
  puVar2 = std::
           __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                     (puVar1,puVar3);
  if ((uint64_t *)puVar2 != puVar3) {
    puVar2 = std::
             __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                       (&desc->id,&desc->creation_time);
    if ((uint64_t *)puVar2 != &desc->creation_time) {
      auVar6[0] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0] ==
                   (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
      auVar6[1] = -((desc->id).super_base_blob<256U>.m_data._M_elems[1] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[1]);
      auVar6[2] = -((desc->id).super_base_blob<256U>.m_data._M_elems[2] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[2]);
      auVar6[3] = -((desc->id).super_base_blob<256U>.m_data._M_elems[3] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[3]);
      auVar6[4] = -((desc->id).super_base_blob<256U>.m_data._M_elems[4] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[4]);
      auVar6[5] = -((desc->id).super_base_blob<256U>.m_data._M_elems[5] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[5]);
      auVar6[6] = -((desc->id).super_base_blob<256U>.m_data._M_elems[6] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[6]);
      auVar6[7] = -((desc->id).super_base_blob<256U>.m_data._M_elems[7] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[7]);
      auVar6[8] = -((desc->id).super_base_blob<256U>.m_data._M_elems[8] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[8]);
      auVar6[9] = -((desc->id).super_base_blob<256U>.m_data._M_elems[9] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[9]);
      auVar6[10] = -((desc->id).super_base_blob<256U>.m_data._M_elems[10] ==
                    (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[10]);
      auVar6[0xb] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0xb] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar6[0xc] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0xc] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar6[0xd] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0xd] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar6[0xe] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0xe] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar6[0xf] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0xf] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar5[0] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x10] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar5[1] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x11] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar5[2] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x12] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar5[3] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x13] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar5[4] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x14] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar5[5] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x15] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar5[6] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x16] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar5[7] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x17] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar5[8] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x18] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar5[9] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x19] ==
                   (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar5[10] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x1a] ==
                    (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar5[0xb] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x1b] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar5[0xc] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x1c] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar5[0xd] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x1d] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar5[0xe] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x1e] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar5[0xf] = -((desc->id).super_base_blob<256U>.m_data._M_elems[0x1f] ==
                     (this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar5 = auVar5 & auVar6;
      bVar4 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff;
      goto LAB_0022af11;
    }
  }
  bVar4 = false;
LAB_0022af11:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::HasWalletDescriptor(const WalletDescriptor& desc) const
{
    LOCK(cs_desc_man);
    return !m_wallet_descriptor.id.IsNull() && !desc.id.IsNull() && m_wallet_descriptor.id == desc.id;
}